

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_magestaff.cpp
# Opt level: O1

int __thiscall AMageStaffFX2::SpecialMissileHit(AMageStaffFX2 *this,AActor *victim)

{
  AActor *pAVar1;
  FName local_c;
  DAngle local_8;
  
  pAVar1 = (this->super_AActor).target.field_0.p;
  if ((pAVar1 != (AActor *)0x0) &&
     (((pAVar1->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
    (this->super_AActor).target.field_0.p = (AActor *)0x0;
    pAVar1 = (AActor *)0x0;
  }
  if (((pAVar1 != victim) && (victim->player == (player_t *)0x0)) &&
     (((victim->flags2).Value & 0x8000) == 0)) {
    pAVar1 = (this->super_AActor).target.field_0.p;
    if ((pAVar1 != (AActor *)0x0) &&
       (((pAVar1->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
      (this->super_AActor).target.field_0.p = (AActor *)0x0;
      pAVar1 = (AActor *)0x0;
    }
    local_c.Index = 0x9f;
    local_8.Degrees = 0.0;
    P_DamageMobj(victim,&this->super_AActor,pAVar1,10,&local_c,0,&local_8);
    return 1;
  }
  return -1;
}

Assistant:

int AMageStaffFX2::SpecialMissileHit (AActor *victim)
{
	if (victim != target &&
		!victim->player &&
		!(victim->flags2 & MF2_BOSS))
	{
		P_DamageMobj (victim, this, target, 10, NAME_Fire);
		return 1;	// Keep going
	}
	return -1;
}